

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

void __thiscall ON_SubD::ClearFragmentColors(ON_SubD *this,bool bClearFragmentColorsMappingTag)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  ON_Color OVar5;
  ON_SubDimple *pOVar6;
  ON_SubDMeshFragment *pOVar7;
  ON_SubDMeshFragmentIterator fragit;
  ON_SubDMeshFragmentIterator local_b0;
  
  pOVar6 = SubDimple(this);
  if (pOVar6 != (ON_SubDimple *)0x0) {
    ON_SubDMeshFragmentIterator::ON_SubDMeshFragmentIterator(&local_b0,this);
    pOVar7 = ON_SubDMeshFragmentIterator::FirstFragment(&local_b0);
    bVar2 = false;
    while (pOVar7 != (ON_SubDMeshFragment *)0x0) {
      bVar3 = bVar2;
      if (!bVar2) {
        bVar3 = true;
        if ((pOVar7->m_vertex_count_etc & 0x1fff) == 0) {
          bVar3 = bVar2;
        }
        if (pOVar7->m_C_stride == 0) {
          bVar3 = bVar2;
        }
        if (pOVar7->m_C == (ON_Color *)0x0) {
          bVar3 = bVar2;
        }
        if ((pOVar7->m_vertex_capacity_etc & 0x2000) == 0) {
          bVar3 = bVar2;
        }
      }
      bVar2 = bVar3;
      pbVar1 = (byte *)((long)&pOVar7->m_vertex_capacity_etc + 1);
      *pbVar1 = *pbVar1 & 0xdf;
      OVar5 = ON_Color::UnsetColor;
      pOVar7->m_ctrlnetC[0].field_0 = ON_Color::UnsetColor.field_0;
      pOVar7->m_ctrlnetC[1].field_0 = OVar5.field_0;
      pOVar7->m_ctrlnetC[2].field_0 = OVar5.field_0;
      pOVar7->m_ctrlnetC[3].field_0 = OVar5.field_0;
      pOVar7 = ON_SubDMeshFragmentIterator::NextFragment(&local_b0);
    }
    if (bClearFragmentColorsMappingTag) {
      *(undefined4 *)((pOVar6->m_fragment_colors_settings_hash).m_digest + 0x10) =
           ON_SHA1_Hash::EmptyContentHash.m_digest._16_4_;
      uVar4 = ON_SHA1_Hash::EmptyContentHash.m_digest._8_8_;
      *(undefined8 *)(pOVar6->m_fragment_colors_settings_hash).m_digest =
           ON_SHA1_Hash::EmptyContentHash.m_digest._0_8_;
      *(undefined8 *)((pOVar6->m_fragment_colors_settings_hash).m_digest + 8) = uVar4;
      pOVar6 = SubDimple(this);
      if (pOVar6 != (ON_SubDimple *)0x0) {
        ON_SubDimple::SetColorsMappingTag(pOVar6,&ON_MappingTag::Unset);
      }
    }
    if (bVar2) {
      ChangeRenderContentSerialNumber(this);
    }
    ON_SubDMeshFragmentIterator::~ON_SubDMeshFragmentIterator(&local_b0);
  }
  return;
}

Assistant:

void ON_SubD::ClearFragmentColors(
  bool bClearFragmentColorsMappingTag
)
{
  const ON_SubDimple* subdimple = this->SubDimple();
  if (nullptr != subdimple)
  {
    bool bFragmentsChanged = false;
    ON_SubDMeshFragmentIterator fragit(*this);
    for (const ON_SubDMeshFragment* frag = fragit.FirstFragment(); nullptr != frag; frag = fragit.NextFragment())
    {
      if (false == bFragmentsChanged && frag->ColorCount() > 0)
        bFragmentsChanged = true;
      frag->SetColorsExistForExperts(false);
    }
    if (bClearFragmentColorsMappingTag)
    {
      subdimple->Internal_SetFragmentColorsSettingsHash(ON_SHA1_Hash::EmptyContentHash);
      this->SetColorsMappingTag(ON_MappingTag::Unset);
    }
    if (bFragmentsChanged)
      this->ChangeRenderContentSerialNumber();
  }
}